

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vocabulary.h
# Opt level: O0

void __thiscall NotFoundException::NotFoundException(NotFoundException *this,string *name)

{
  exception *in_RDI;
  char *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__NotFoundException_00192d58;
  std::__cxx11::string::string((string *)(in_RDI + 8));
  std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::__cxx11::string::operator=((string *)(in_RDI + 8),(string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

NotFoundException(string name) {
        this->error_message = name + " is not found";
    }